

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O3

bool __thiscall
CommandLineArguments::setOutputType(CommandLineArguments *this,int ac,char **av,int *i)

{
  bool bVar1;
  OutputType OVar2;
  size_t sVar3;
  int ac_00;
  SimpleString outputType;
  SimpleString SStack_58;
  undefined1 local_48 [32];
  
  ac_00 = 0x1472c7;
  SimpleString::SimpleString(&SStack_58,"-o");
  getParameterField((CommandLineArguments *)local_48,ac_00,(char **)(ulong)(uint)ac,(int *)av,
                    (SimpleString *)i);
  SimpleString::~SimpleString(&SStack_58);
  sVar3 = SimpleString::size((SimpleString *)local_48);
  if (sVar3 == 0) {
LAB_0014014a:
    bVar1 = false;
  }
  else {
    SimpleString::SimpleString(&SStack_58,"normal");
    bVar1 = operator==((SimpleString *)local_48,&SStack_58);
    if (bVar1) {
      SimpleString::~SimpleString(&SStack_58);
      OVar2 = OUTPUT_ECLIPSE;
    }
    else {
      SimpleString::SimpleString((SimpleString *)(local_48 + 0x10),"eclipse");
      bVar1 = operator==((SimpleString *)local_48,(SimpleString *)(local_48 + 0x10));
      SimpleString::~SimpleString((SimpleString *)(local_48 + 0x10));
      SimpleString::~SimpleString(&SStack_58);
      OVar2 = OUTPUT_ECLIPSE;
      if (!bVar1) {
        SimpleString::SimpleString(&SStack_58,"junit");
        bVar1 = operator==((SimpleString *)local_48,&SStack_58);
        SimpleString::~SimpleString(&SStack_58);
        OVar2 = OUTPUT_JUNIT;
        if (!bVar1) {
          SimpleString::SimpleString(&SStack_58,"teamcity");
          bVar1 = operator==((SimpleString *)local_48,&SStack_58);
          SimpleString::~SimpleString(&SStack_58);
          OVar2 = OUTPUT_TEAMCITY;
          if (!bVar1) goto LAB_0014014a;
        }
      }
    }
    this->outputType_ = OVar2;
    bVar1 = true;
  }
  SimpleString::~SimpleString((SimpleString *)local_48);
  return bVar1;
}

Assistant:

bool CommandLineArguments::setOutputType(int ac, const char *const *av, int& i)
{
    SimpleString outputType = getParameterField(ac, av, i, "-o");
    if (outputType.size() == 0) return false;

    if (outputType == "normal" || outputType == "eclipse") {
        outputType_ = OUTPUT_ECLIPSE;
        return true;
    }
    if (outputType == "junit") {
        outputType_ = OUTPUT_JUNIT;
        return true;
    }
    if (outputType == "teamcity") {
        outputType_ = OUTPUT_TEAMCITY;
        return true;
    }

    return false;
}